

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_argv.cpp
# Opt level: O0

void __thiscall DArgs::CollectFiles(DArgs *this,char *param,char *extension)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  FString *pFVar4;
  char *pcVar5;
  bool bVar6;
  bool local_b1;
  size_t local_70;
  FString local_60;
  size_t local_58;
  size_t len;
  bool useit;
  size_t local_40;
  size_t extlen;
  undefined1 local_30 [4];
  uint i;
  TArray<FString,_FString> work;
  char *extension_local;
  char *param_local;
  DArgs *this_local;
  
  work._8_8_ = extension;
  TArray<FString,_FString>::TArray((TArray<FString,_FString> *)local_30);
  if (work._8_8_ == 0) {
    local_70 = 0;
  }
  else {
    local_70 = strlen((char *)work._8_8_);
  }
  local_40 = local_70;
  extlen._4_4_ = 1;
  while( true ) {
    uVar3 = extlen._4_4_;
    uVar1 = TArray<FString,_FString>::Size(&this->Argv);
    bVar6 = false;
    if (uVar3 < uVar1) {
      pFVar4 = TArray<FString,_FString>::operator[](&this->Argv,(ulong)extlen._4_4_);
      pcVar5 = FString::operator[](pFVar4,0);
      bVar6 = false;
      if (*pcVar5 != '-') {
        pFVar4 = TArray<FString,_FString>::operator[](&this->Argv,(ulong)extlen._4_4_);
        pcVar5 = FString::operator[](pFVar4,0);
        bVar6 = *pcVar5 != '+';
      }
    }
    if (!bVar6) break;
    if (local_40 == 0) {
      len._3_1_ = true;
    }
    else {
      pFVar4 = TArray<FString,_FString>::operator[](&this->Argv,(ulong)extlen._4_4_);
      local_58 = FString::Len(pFVar4);
      local_b1 = false;
      if (local_40 <= local_58) {
        pFVar4 = TArray<FString,_FString>::operator[](&this->Argv,(ulong)extlen._4_4_);
        pcVar5 = FString::operator[](pFVar4,local_58 - local_40);
        iVar2 = strcasecmp(pcVar5,(char *)work._8_8_);
        local_b1 = iVar2 == 0;
      }
      len._3_1_ = local_b1;
    }
    if ((bool)len._3_1_ == false) {
      extlen._4_4_ = extlen._4_4_ + 1;
    }
    else {
      pFVar4 = TArray<FString,_FString>::operator[](&this->Argv,(ulong)extlen._4_4_);
      TArray<FString,_FString>::Push((TArray<FString,_FString> *)local_30,pFVar4);
      TArray<FString,_FString>::Delete(&this->Argv,extlen._4_4_);
    }
  }
  while (extlen._4_4_ = CheckParm(this,param,extlen._4_4_), extlen._4_4_ != 0) {
    TArray<FString,_FString>::Delete(&this->Argv,extlen._4_4_);
    while( true ) {
      uVar3 = extlen._4_4_;
      uVar1 = TArray<FString,_FString>::Size(&this->Argv);
      bVar6 = false;
      if (uVar3 < uVar1) {
        pFVar4 = TArray<FString,_FString>::operator[](&this->Argv,(ulong)extlen._4_4_);
        pcVar5 = FString::operator[](pFVar4,0);
        bVar6 = false;
        if (*pcVar5 != '-') {
          pFVar4 = TArray<FString,_FString>::operator[](&this->Argv,(ulong)extlen._4_4_);
          pcVar5 = FString::operator[](pFVar4,0);
          bVar6 = *pcVar5 != '+';
        }
      }
      if (!bVar6) break;
      pFVar4 = TArray<FString,_FString>::operator[](&this->Argv,(ulong)extlen._4_4_);
      TArray<FString,_FString>::Push((TArray<FString,_FString> *)local_30,pFVar4);
      TArray<FString,_FString>::Delete(&this->Argv,extlen._4_4_);
    }
  }
  uVar3 = TArray<FString,_FString>::Size((TArray<FString,_FString> *)local_30);
  if (uVar3 != 0) {
    FString::FString(&local_60,param);
    TArray<FString,_FString>::Push(&this->Argv,&local_60);
    FString::~FString(&local_60);
    uVar3 = TArray<FString,_FString>::Size((TArray<FString,_FString> *)local_30);
    pFVar4 = TArray<FString,_FString>::operator[]((TArray<FString,_FString> *)local_30,0);
    AppendArgs(this,uVar3,pFVar4);
  }
  TArray<FString,_FString>::~TArray((TArray<FString,_FString> *)local_30);
  return;
}

Assistant:

void DArgs::CollectFiles(const char *param, const char *extension)
{
	TArray<FString> work;
	unsigned int i;
	size_t extlen = extension == NULL ? 0 : strlen(extension);

	// Step 1: Find suitable arguments before the first switch.
	i = 1;
	while (i < Argv.Size() && Argv[i][0] != '-' && Argv[i][0] != '+')
	{
		bool useit;

		if (extlen > 0)
		{ // Argument's extension must match.
			size_t len = Argv[i].Len();
			useit = (len >= extlen && stricmp(&Argv[i][len - extlen], extension) == 0);
		}
		else
		{ // Anything will do so long as it's before the first switch.
			useit = true;
		}
		if (useit)
		{
			work.Push(Argv[i]);
			Argv.Delete(i);
		}
		else
		{
			i++;
		}
	}

	// Step 2: Find each occurence of -param and add its arguments to work.
	while ((i = CheckParm(param, i)) > 0)
	{
		Argv.Delete(i);
		while (i < Argv.Size() && Argv[i][0] != '-' && Argv[i][0] != '+')
		{
			work.Push(Argv[i]);
			Argv.Delete(i);
		}
	}

	// Optional: Replace short path names with long path names
#ifdef _WIN32
	for (i = 0; i < work.Size(); ++i)
	{
		work[i] = I_GetLongPathName(work[i]);
	}
#endif

	// Step 3: Add work back to Argv, as long as it's non-empty.
	if (work.Size() > 0)
	{
		Argv.Push(param);
		AppendArgs(work.Size(), &work[0]);
	}
}